

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O0

int NextProtoSelectCallback(SSL *ssl,uint8_t **out,uint8_t *outlen,uint8_t *in,uint inlen,void *arg)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  TestConfig *config;
  void *arg_local;
  uint inlen_local;
  uint8_t *in_local;
  uint8_t *outlen_local;
  uint8_t **out_local;
  SSL *ssl_local;
  
  GetTestConfig(ssl);
  puVar2 = (uint8_t *)std::__cxx11::string::data();
  *out = puVar2;
  uVar1 = std::__cxx11::string::size();
  *outlen = uVar1;
  return 0;
}

Assistant:

static int NextProtoSelectCallback(SSL *ssl, uint8_t **out, uint8_t *outlen,
                                   const uint8_t *in, unsigned inlen,
                                   void *arg) {
  const TestConfig *config = GetTestConfig(ssl);
  *out = (uint8_t *)config->select_next_proto.data();
  *outlen = config->select_next_proto.size();
  return SSL_TLSEXT_ERR_OK;
}